

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

bool __thiscall Moc::parseClassHead(Moc *this,ClassDef *def)

{
  int iVar1;
  QHash<QByteArray,_QByteArray> *this_00;
  QByteArray *args;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  Token TVar6;
  QByteArray *pQVar7;
  Access AVar8;
  int k;
  long in_FS_OFFSET;
  Type type;
  char *local_98;
  char *local_90;
  QArrayDataPointer<char> local_88;
  SuperClass local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  k = 0;
  while( true ) {
    do {
      iVar1 = k + 1;
      TVar6 = Parser::lookup(&this->super_Parser,k);
      k = iVar1;
    } while (COLON < TVar6);
    if ((0x84001U >> (TVar6 & TRY) & 1) != 0) break;
    if ((0x40100U >> (TVar6 & TRY) & 1) != 0) {
LAB_0011322b:
      bVar5 = false;
LAB_00113626:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return bVar5;
    }
  }
  skipCxxAttributes(this);
  bVar5 = Parser::test(&this->super_Parser,IDENTIFIER);
  if (bVar5) {
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    Parser::lexem((QByteArray *)&local_88,&this->super_Parser);
    bVar5 = Parser::test(&this->super_Parser,LPAREN);
    if (bVar5) {
      until(this,PP_RPAREN);
      bVar5 = Parser::test(&this->super_Parser,IDENTIFIER);
      if (!bVar5) goto LAB_0011361a;
      Parser::lexem(&type.name,&this->super_Parser);
      qVar4 = local_88.size;
      pcVar3 = local_88.ptr;
      pDVar2 = local_88.d;
      local_88.d = type.name.d.d;
      local_88.ptr = type.name.d.ptr;
      type.name.d.d = pDVar2;
      type.name.d.ptr = pcVar3;
      local_88.size = type.name.d.size;
      type.name.d.size = qVar4;
LAB_001132cd:
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&type);
    }
    else {
      bVar5 = Parser::test(&this->super_Parser,IDENTIFIER);
      if (bVar5) {
        type.name.d.size = -0x5555555555555556;
        type.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        type.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        Parser::lexem(&type.name,&this->super_Parser);
        local_70.classname.d.d = (Data *)0x135ba4;
        bVar5 = operator!=(&type.name,(char **)&local_70);
        if (bVar5) {
          local_90 = "sealed";
          bVar5 = operator!=(&type.name,&local_90);
          if (bVar5) {
            local_98 = "Q_DECL_FINAL";
            bVar5 = operator!=(&type.name,&local_98);
            if (bVar5) {
              QByteArray::operator=((QByteArray *)&local_88,&type.name);
            }
          }
        }
        goto LAB_001132cd;
      }
    }
    args = &(def->super_BaseDef).qualified;
    QByteArray::append(args);
    while (bVar5 = Parser::test(&this->super_Parser,SCOPE), bVar5) {
      Parser::lexem(&type.name,&this->super_Parser);
      QByteArray::append(args);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&type);
      bVar5 = Parser::test(&this->super_Parser,IDENTIFIER);
      if (bVar5) {
        Parser::lexem(&type.name,&this->super_Parser);
        qVar4 = local_88.size;
        pcVar3 = local_88.ptr;
        pDVar2 = local_88.d;
        local_88.d = type.name.d.d;
        local_88.ptr = type.name.d.ptr;
        type.name.d.d = pDVar2;
        type.name.d.ptr = pcVar3;
        local_88.size = type.name.d.size;
        type.name.d.size = qVar4;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&type);
        QByteArray::append(args);
      }
    }
    QByteArray::operator=((QByteArray *)def,(QByteArray *)&local_88);
    (def->super_BaseDef).lineNumber =
         (long)(this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum;
    bVar5 = Parser::test(&this->super_Parser,IDENTIFIER);
    if (bVar5) {
      type.name.d.size = -0x5555555555555556;
      type.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      type.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      Parser::lexem(&type.name,&this->super_Parser);
      local_70.classname.d.d = (Data *)0x135ba4;
      bVar5 = operator!=(&type.name,(char **)&local_70);
      if (!bVar5) {
LAB_00113444:
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&type);
        goto LAB_0011344e;
      }
      local_90 = "sealed";
      bVar5 = operator!=(&type.name,&local_90);
      if (!bVar5) goto LAB_00113444;
      local_98 = "Q_DECL_FINAL";
      bVar5 = operator!=(&type.name,&local_98);
      if (!bVar5) goto LAB_00113444;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&type);
LAB_0011361a:
      bVar5 = false;
    }
    else {
LAB_0011344e:
      bVar5 = Parser::test(&this->super_Parser,COLON);
      if (bVar5) {
        do {
          Parser::test(&this->super_Parser,VIRTUAL);
          bVar5 = Parser::test(&this->super_Parser,PRIVATE);
          AVar8 = Private;
          if (!bVar5) {
            bVar5 = Parser::test(&this->super_Parser,PROTECTED);
            AVar8 = Protected;
            if (!bVar5) {
              Parser::test(&this->super_Parser,PUBLIC);
              AVar8 = Public;
            }
          }
          Parser::test(&this->super_Parser,VIRTUAL);
          type._48_4_ = 0xaaaaaaaa;
          type.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
               (QFlagsStorageHelper<TypeTag,_4>)0xaaaaaaaa;
          type.firstToken = 0xaaaaaaaa;
          type.referenceType = 0xaaaaaaaa;
          type.rawName.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          type.rawName.d.size = -0x5555555555555556;
          type.name.d.size = -0x5555555555555556;
          type.rawName.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          type.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          type.name.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          parseType(&type,this);
          bVar5 = Parser::test(&this->super_Parser,LPAREN);
          if (bVar5) {
            until(this,PP_RPAREN);
          }
          else {
            local_70.classname.d.d = type.name.d.d;
            local_70.classname.d.ptr = type.name.d.ptr;
            local_70.classname.d.size = type.name.d.size;
            if (type.name.d.d != (Data *)0x0) {
              LOCK();
              ((type.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((type.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
            pQVar7 = toFullyQualified(this,&type.name);
            local_70.qualified.d.d = (pQVar7->d).d;
            local_70.qualified.d.ptr = (pQVar7->d).ptr;
            local_70.qualified.d.size = (pQVar7->d).size;
            if (local_70.qualified.d.d != (Data *)0x0) {
              LOCK();
              ((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i = ((local_70.qualified.d.d)->super_QArrayData).ref_._q_value.
                     super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            local_70.access = AVar8;
            QList<SuperClass>::emplaceBack<SuperClass>(&def->superclassList,&local_70);
            SuperClass::~SuperClass(&local_70);
          }
          Type::~Type(&type);
          bVar5 = Parser::test(&this->super_Parser,COMMA);
        } while (bVar5);
        if ((def->superclassList).d.size != 0) {
          this_00 = &this->knownGadgets;
          bVar5 = QHash<QByteArray,_QByteArray>::contains
                            (this_00,&((def->superclassList).d.ptr)->classname);
          if (bVar5) {
            QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                      ((QHash<QByteArray,QByteArray> *)this_00,(QByteArray *)def,args);
            QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
                      ((QHash<QByteArray,QByteArray> *)this_00,args,args);
          }
        }
      }
      bVar5 = Parser::test(&this->super_Parser,LBRACE);
      if (!bVar5) goto LAB_0011361a;
      (def->super_BaseDef).begin = (this->super_Parser).index + -1;
      bVar5 = until(this,RBRACE);
      (def->super_BaseDef).end = (this->super_Parser).index;
      (this->super_Parser).index = (def->super_BaseDef).begin + 1;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
    goto LAB_00113626;
  }
  goto LAB_0011322b;
}

Assistant:

bool Moc::parseClassHead(ClassDef *def)
{
    // figure out whether this is a class declaration, or only a
    // forward or variable declaration.
    int i = 0;
    Token token;
    do {
        token = lookup(i++);
        if (token == COLON || token == LBRACE)
            break;
        if (token == SEMIC || token == RANGLE)
            return false;
    } while (token);

    // support attributes like "class [[deprecated]]] name"
    skipCxxAttributes();

    if (!test(IDENTIFIER)) // typedef struct { ... }
        return false;
    QByteArray name = lexem();

    // support "class IDENT name" and "class IDENT(IDENT) name"
    // also support "class IDENT name (final|sealed|Q_DECL_FINAL)"
    if (test(LPAREN)) {
        until(RPAREN);
        if (!test(IDENTIFIER))
            return false;
        name = lexem();
    } else  if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            name = lex;
    }

    def->qualified += name;
    while (test(SCOPE)) {
        def->qualified += lexem();
        if (test(IDENTIFIER)) {
            name = lexem();
            def->qualified += name;
        }
    }
    def->classname = name;
    def->lineNumber = symbol().lineNum;

    if (test(IDENTIFIER)) {
        const QByteArray lex = lexem();
        if (lex != "final" && lex != "sealed" && lex != "Q_DECL_FINAL")
            return false;
    }

    if (test(COLON)) {
        do {
            test(VIRTUAL);
            FunctionDef::Access access = FunctionDef::Public;
            if (test(PRIVATE))
                access = FunctionDef::Private;
            else if (test(PROTECTED))
                access = FunctionDef::Protected;
            else
                test(PUBLIC);
            test(VIRTUAL);
            const Type type = parseType();
            // ignore the 'class Foo : BAR(Baz)' case
            if (test(LPAREN)) {
                until(RPAREN);
            } else {
                def->superclassList.push_back({type.name, toFullyQualified(type.name), access});
            }
        } while (test(COMMA));

        if (!def->superclassList.isEmpty()
            && knownGadgets.contains(def->superclassList.constFirst().classname)) {
            // Q_GADGET subclasses are treated as Q_GADGETs
            knownGadgets.insert(def->classname, def->qualified);
            knownGadgets.insert(def->qualified, def->qualified);
        }
    }
    if (!test(LBRACE))
        return false;
    def->begin = index - 1;
    bool foundRBrace = until(RBRACE);
    def->end = index;
    index = def->begin + 1;
    return foundRBrace;
}